

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TokenizerBase.cpp
# Opt level: O3

void __thiscall SGParser::TokenizerBase::AdjustHead(TokenizerBase *this)

{
  TokenizerBuffer *pTVar1;
  TokenizerBuffer *pTVar2;
  
  pTVar2 = this->pHeadBuffer;
  if ((pTVar2 != (TokenizerBuffer *)0x0) &&
     (pTVar1 = this->pTailBuffer, pTVar1 != (TokenizerBuffer *)0x0)) {
    this->pHead = this->pTail;
    if (pTVar2 != pTVar1) {
      if (this->pFreeBuffer == (TokenizerBuffer *)0x0) {
        this->pFreeBuffer = pTVar2;
        pTVar2 = pTVar2->pNext;
        this->pHeadBuffer = pTVar2;
      }
      if (pTVar2 != pTVar1) {
        do {
          this->pHeadBuffer = pTVar2->pNext;
          operator_delete(pTVar2,0x2010);
          pTVar2 = this->pHeadBuffer;
        } while (pTVar2 != this->pTailBuffer);
      }
    }
    return;
  }
  __assert_fail("pHeadBuffer && pTailBuffer",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Parser-Builder-Org[P]SGParser/src/Parser/TokenizerBase.cpp"
                ,0x84,"void SGParser::TokenizerBase::AdjustHead()");
}

Assistant:

void TokenizerBase::AdjustHead() noexcept {
    SG_ASSERT(pHeadBuffer && pTailBuffer);

    // Move the Head to the Tail
    pHead = pTail;

    // Need to destroy a buffer
    if (pHeadBuffer != pTailBuffer) {
        // Save one of the buffers
        if (!pFreeBuffer) {
            pFreeBuffer = pHeadBuffer;
            pHeadBuffer = pHeadBuffer->pNext;
        }

        // Now go through and destroy all unused buffers
        while (pHeadBuffer != pTailBuffer)
            delete std::exchange(pHeadBuffer, pHeadBuffer->pNext);
    }
}